

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void ImGui::SetScrollY(float scroll_y)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  float fVar3;
  float fVar4;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  fVar4 = 0.0;
  fVar3 = 0.0;
  if ((pIVar1->Flags & 1U) == 0) {
    fVar3 = (pIVar2->Style).FramePadding.y;
    fVar3 = fVar3 + fVar3 + pIVar2->FontBaseSize * pIVar1->FontWindowScale;
  }
  if (((uint)pIVar1->Flags >> 10 & 1) != 0) {
    fVar4 = (pIVar2->Style).FramePadding.y;
    fVar4 = fVar4 + fVar4 +
            pIVar2->FontBaseSize * pIVar1->FontWindowScale + (pIVar1->DC).MenuBarOffset.y;
  }
  (pIVar1->ScrollTarget).y = fVar3 + scroll_y + fVar4;
  (pIVar1->ScrollTargetCenterRatio).y = 0.0;
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->WriteAccessed = true; return g.CurrentWindow; }